

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

Offset<reflection::Enum> __thiscall
flatbuffers::EnumDef::Serialize(EnumDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  bool e;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  string *psVar1;
  pointer pcVar2;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> OVar3;
  Offset<reflection::Type> off;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> off_00;
  Offset<flatbuffers::String> off_01;
  Offset<reflection::Enum> OVar4;
  pointer ppEVar5;
  Offset<reflection::EnumVal> *v;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> off_02;
  vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  enumval_offsets;
  string decl_file_in_project;
  string qualified_name;
  EnumBuilder local_a8;
  Offset<reflection::EnumVal> *local_98;
  iterator iStack_90;
  Offset<reflection::EnumVal> *local_88;
  Offset<flatbuffers::String> local_78;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> local_74;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  string local_50;
  
  local_98 = (Offset<reflection::EnumVal> *)0x0;
  iStack_90._M_current = (Offset<reflection::EnumVal> *)0x0;
  local_88 = (Offset<reflection::EnumVal> *)0x0;
  ppEVar5 = (this->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar5 !=
      (this->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_50._M_dataplus._M_p._0_4_ = EnumVal::Serialize(*ppEVar5,builder,parser);
      if (iStack_90._M_current == local_88) {
        std::
        vector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>
        ::_M_realloc_insert<flatbuffers::Offset<reflection::EnumVal>>
                  ((vector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>
                    *)&local_98,iStack_90,(Offset<reflection::EnumVal> *)&local_50);
      }
      else {
        (iStack_90._M_current)->o = local_50._M_dataplus._M_p._0_4_;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      ppEVar5 = ppEVar5 + 1;
    } while (ppEVar5 !=
             (this->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  Namespace::GetFullyQualifiedName
            (&local_50,(this->super_Definition).defined_namespace,(string *)this,1000);
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (builder,(char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                      local_50._M_dataplus._M_p._0_4_),local_50._M_string_length);
  local_78.o = (builder->buf_).size_;
  v = (Offset<reflection::EnumVal> *)
      &data<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>(std::vector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>const&)
       ::t;
  if ((long)iStack_90._M_current - (long)local_98 != 0) {
    v = local_98;
  }
  OVar3 = FlatBufferBuilderImpl<false>::CreateVector<reflection::EnumVal>
                    (builder,v,(long)iStack_90._M_current - (long)local_98 >> 2);
  off = Type::Serialize(&this->underlying_type,builder);
  local_74 = OVar3;
  off_00 = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  off_02.o = 0;
  if ((parser->opts).binary_schema_comments == true) {
    begin._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    end._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (begin._M_current != end._M_current) {
      off_02 = FlatBufferBuilderImpl<false>::
               CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (builder,begin,end);
    }
  }
  psVar1 = (this->super_Definition).declaration_file;
  local_70 = local_60;
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  }
  else {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + psVar1->_M_string_length);
  }
  off_01 = FlatBufferBuilderImpl<false>::CreateSharedString(builder,(char *)local_70,local_68);
  e = this->is_union;
  local_a8.fbb_ = builder;
  FlatBufferBuilderImpl<false>::NotNested(builder);
  builder->nested = true;
  local_a8.start_ = (builder->buf_).size_;
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(local_a8.fbb_,0x10,off_01);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (local_a8.fbb_,0xe,off_02);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>>
            (local_a8.fbb_,0xc,off_00);
  FlatBufferBuilderImpl<false>::AddOffset<reflection::Type>(local_a8.fbb_,10,off);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,unsigned_int>>
            (local_a8.fbb_,6,local_74);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(local_a8.fbb_,4,local_78);
  FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(local_a8.fbb_,8,e,'\0');
  OVar4 = reflection::EnumBuilder::Finish(&local_a8);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != (Offset<reflection::EnumVal> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return (Offset<reflection::Enum>)OVar4.o;
}

Assistant:

Offset<reflection::Enum> EnumDef::Serialize(FlatBufferBuilder *builder,
                                            const Parser &parser) const {
  std::vector<Offset<reflection::EnumVal>> enumval_offsets;
  for (auto it = vals.vec.begin(); it != vals.vec.end(); ++it) {
    enumval_offsets.push_back((*it)->Serialize(builder, parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto vals__ = builder->CreateVector(enumval_offsets);
  const auto type__ = underlying_type.Serialize(builder);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateEnum(*builder, name__, vals__, is_union, type__,
                                attr__, docs__, file__);
}